

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

void anon_unknown.dwarf_418ba7::seterror(cppcms_capi_exception *c,int code,exception *e)

{
  char *pcVar1;
  char *__s;
  
  if (c->code == 0) {
    c->code = code;
    __s = (char *)(**(code **)(*(long *)e + 0x10))(e);
    pcVar1 = (char *)(c->s_msg)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&c->s_msg,0,pcVar1,(ulong)__s);
    c->msg = (c->s_msg)._M_dataplus._M_p;
  }
  return;
}

Assistant:

void seterror(cppcms_capi_exception &c,int code,std::exception const &e) 
	{
		if(c.code)
			return;
		c.code = code;
		try {
			c.s_msg = e.what();
			c.msg = c.s_msg.c_str();
		}
		catch(...) {
			strncpy(c.c_msg,e.what(),sizeof(c.c_msg)-1);
			c.msg = c.c_msg;
		}
	}